

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

void __thiscall ymfm::ym2608::clock_fm_and_adpcm(ym2608 *this)

{
  output_data *output;
  uint8_t uVar1;
  uint uVar2;
  uint32_t index;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint32_t chnum;
  long lVar6;
  
  uVar1 = this->m_irq_enable;
  uVar3 = fm_engine_base<ymfm::opn_registers_base<true>_>::clock
                    ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  if ((uVar3 & 3) == 0) {
    adpcm_a_engine::clock(&this->m_adpcm_a);
  }
  uVar4 = 0x3f;
  if (-1 < (char)uVar1) {
    uVar4 = 7;
  }
  adpcm_b_engine::clock(&this->m_adpcm_b);
  output = &this->m_last_fm;
  *(undefined8 *)(this->m_last_fm).data = 0;
  uVar2 = (this->m_fm).m_active_channels;
  lVar6 = 0;
  do {
    if (((uVar4 & uVar2) >> ((uint)lVar6 & 0x1f) & 1) != 0) {
      fm_channel<ymfm::opn_registers_base<true>_>::output_4op
                ((fm_channel<ymfm::opn_registers_base<true>_> *)
                 (this->m_fm).m_channel[lVar6]._M_t.
                 super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                 ,output,1,0x7fff);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  adpcm_a_engine::output<2>(&this->m_adpcm_a,output,0x3f);
  adpcm_b_engine::output<2>(&this->m_adpcm_b,output,1);
  lVar6 = 0;
  do {
    iVar5 = output->data[lVar6];
    if (0x7ffe < iVar5) {
      iVar5 = 0x7fff;
    }
    if (iVar5 < -0x7fff) {
      iVar5 = -0x8000;
    }
    output->data[lVar6] = iVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  return;
}

Assistant:

void ym2608::clock_fm_and_adpcm()
{
	// top bit of the IRQ enable flags controls 3-channel vs 6-channel mode
	uint32_t fmmask = bitfield(m_irq_enable, 7) ? 0x3f : 0x07;

	// clock the system
	uint32_t env_counter = m_fm.clock(fm_engine::ALL_CHANNELS);

	// clock the ADPCM-A engine on every envelope cycle
	// (channels 4 and 5 clock every 2 envelope clocks)
	if (bitfield(env_counter, 0, 2) == 0)
		m_adpcm_a.clock(bitfield(env_counter, 2) ? 0x0f : 0x3f);

	// clock the ADPCM-B engine every cycle
	m_adpcm_b.clock();

	// update the FM content; OPNA is 13-bit with no intermediate clipping
	m_fm.output(m_last_fm.clear(), 1, 32767, fmmask);

	// mix in the ADPCM and clamp
	m_adpcm_a.output(m_last_fm, 0x3f);
	m_adpcm_b.output(m_last_fm, 1);
	m_last_fm.clamp16();
}